

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineVertexInputDivisorStateCreateInfoKHR *create_info,
          ScratchAllocator *alloc)

{
  VkPipelineVertexInputDivisorStateCreateInfo *pVVar1;
  VkVertexInputBindingDivisorDescription *pVVar2;
  
  pVVar1 = copy<VkPipelineVertexInputDivisorStateCreateInfo>(this,create_info,1,alloc);
  if (pVVar1->pVertexBindingDivisors != (VkVertexInputBindingDivisorDescription *)0x0) {
    pVVar2 = copy<VkVertexInputBindingDivisorDescription>
                       (this,create_info->pVertexBindingDivisors,
                        (ulong)create_info->vertexBindingDivisorCount,alloc);
    pVVar1->pVertexBindingDivisors = pVVar2;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(
		const VkPipelineVertexInputDivisorStateCreateInfoKHR *create_info,
		ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pVertexBindingDivisors)
	{
		info->pVertexBindingDivisors = copy(create_info->pVertexBindingDivisors,
		                                    create_info->vertexBindingDivisorCount,
		                                    alloc);
	}

	return info;
}